

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::CalculatePosition
          (SscReaderGeneric *this,BlockVecVec *bvv,RankPosMap *allRanks)

{
  pointer pvVar1;
  pointer pBVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  __node_base *p_Var8;
  pointer pBVar9;
  unsigned_long uVar10;
  RankPosMap *__range4;
  key_type local_3c;
  _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  local_3c = 0;
  if (0 < (int)((ulong)((long)(bvv->
                              super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(bvv->
                             super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    uVar10 = 0;
    local_38 = (_Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)allRanks;
    do {
      bVar5 = false;
      p_Var8 = &(allRanks->_M_h)._M_before_begin;
      do {
        p_Var8 = p_Var8->_M_nxt;
        if (p_Var8 == (__node_base *)0x0) goto LAB_00147e1b;
      } while ((int)*(size_type *)(p_Var8 + 1) != local_3c);
      bVar5 = true;
LAB_00147e1b:
      if (bVar5) {
        pmVar3 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_38,&local_3c);
        pmVar3->first = uVar10;
        lVar7 = (long)local_3c;
        pvVar1 = (bvv->
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = *(pointer *)
                  ((long)&pvVar1[lVar7].
                          super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (pBVar9 = pvVar1[lVar7].
                      super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start; pBVar9 != pBVar2;
            pBVar9 = pBVar9 + 1) {
          pBVar9->bufferStart = pBVar9->bufferStart + uVar10;
        }
        sVar4 = TotalDataSize(pvVar1 + lVar7);
        pmVar3 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_38,&local_3c);
        pmVar3->second = sVar4 + 1;
        uVar10 = uVar10 + sVar4 + 1;
      }
      local_3c = local_3c + 1;
      iVar6 = (int)((ulong)((long)(bvv->
                                  super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(bvv->
                                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(local_3c,iVar6 * -0x55555555) != local_3c + iVar6 * 0x55555555 < 0);
  }
  return;
}

Assistant:

void SscReaderGeneric::CalculatePosition(ssc::BlockVecVec &bvv, ssc::RankPosMap &allRanks)
{

    size_t bufferPosition = 0;

    for (int rank = 0; rank < static_cast<int>(bvv.size()); ++rank)
    {
        bool hasOverlap = false;
        for (const auto &r : allRanks)
        {
            if (r.first == rank)
            {
                hasOverlap = true;
                break;
            }
        }
        if (hasOverlap)
        {
            allRanks[rank].first = bufferPosition;
            auto &bv = bvv[rank];
            for (auto &b : bv)
            {
                b.bufferStart += bufferPosition;
            }
            size_t currentRankTotalSize = ssc::TotalDataSize(bv);
            allRanks[rank].second = currentRankTotalSize + 1;
            bufferPosition += currentRankTotalSize + 1;
        }
    }
}